

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O2

cbtDbvtNode * createnode(cbtDbvt *pdbvt,cbtDbvtNode *parent,void *data)

{
  cbtDbvtNode *pcVar1;
  
  pcVar1 = pdbvt->m_free;
  if (pcVar1 == (cbtDbvtNode *)0x0) {
    pcVar1 = (cbtDbvtNode *)cbtAlignedAllocInternal(0x38,0x10);
    (pcVar1->volume).mi.m_floats[0] = 0.0;
    (pcVar1->volume).mi.m_floats[1] = 0.0;
    (pcVar1->volume).mi.m_floats[2] = 0.0;
    (pcVar1->volume).mi.m_floats[3] = 0.0;
    (pcVar1->volume).mx.m_floats[0] = 0.0;
    (pcVar1->volume).mx.m_floats[1] = 0.0;
    (pcVar1->volume).mx.m_floats[2] = 0.0;
    (pcVar1->volume).mx.m_floats[3] = 0.0;
    (pcVar1->volume).mx.m_floats[2] = 0.0;
    (pcVar1->volume).mx.m_floats[3] = 0.0;
    pcVar1->parent = (cbtDbvtNode *)0x0;
    (pcVar1->field_2).childs[0] = (cbtDbvtNode *)0x0;
    (pcVar1->field_2).childs[1] = (cbtDbvtNode *)0x0;
  }
  else {
    pdbvt->m_free = (cbtDbvtNode *)0x0;
  }
  pcVar1->parent = parent;
  (pcVar1->field_2).data = data;
  (pcVar1->field_2).childs[1] = (cbtDbvtNode *)0x0;
  return pcVar1;
}

Assistant:

static DBVT_INLINE cbtDbvtNode* createnode(cbtDbvt* pdbvt,
										  cbtDbvtNode* parent,
										  void* data)
{
	cbtDbvtNode* node;
	if (pdbvt->m_free)
	{
		node = pdbvt->m_free;
		pdbvt->m_free = 0;
	}
	else
	{
		node = new (cbtAlignedAlloc(sizeof(cbtDbvtNode), 16)) cbtDbvtNode();
	}
	node->parent = parent;
	node->data = data;
	node->childs[1] = 0;
	return (node);
}